

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

SamplingMode * __thiscall
CoreML::Specification::ResizeBilinearLayerParams::_internal_mutable_mode
          (ResizeBilinearLayerParams *this)

{
  ulong uVar1;
  SamplingMode *pSVar2;
  Arena *arena;
  
  if (this->mode_ != (SamplingMode *)0x0) {
    return this->mode_;
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    arena = *(Arena **)arena;
  }
  pSVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SamplingMode>(arena);
  this->mode_ = pSVar2;
  return pSVar2;
}

Assistant:

inline ::CoreML::Specification::SamplingMode* ResizeBilinearLayerParams::_internal_mutable_mode() {
  
  if (mode_ == nullptr) {
    auto* p = CreateMaybeMessage<::CoreML::Specification::SamplingMode>(GetArenaForAllocation());
    mode_ = p;
  }
  return mode_;
}